

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O1

int __thiscall xr_entity_factory::init(xr_entity_factory *this,EVP_PKEY_CTX *ctx)

{
  vector<factory_item_base_*,_std::allocator<factory_item_base_*>_> *this_00;
  pointer ppfVar1;
  pointer ppfVar2;
  long lVar3;
  xr_entity_factory *pxVar4;
  int iVar5;
  int extraout_EAX;
  factory_item_base *pfVar6;
  uint64_t uVar7;
  ulong uVar9;
  factory_item_base *local_40;
  xr_entity_factory *local_38;
  reference ppfVar8;
  
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_GRAPH");
  this_00 = &this->m_clsids;
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a570;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("ON_OFF_G");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a5b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("O_ACTOR");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a5f0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_FLESH");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a630;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_HIMER");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a630;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_DOG_R");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a630;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_STL");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a670;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_BLOOD");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a630;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_BOAR");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a630;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_DOG_B");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a630;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_DOG_P");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a630;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_DOG_F");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a6b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_BURER");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a630;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_GIANT");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a630;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_CONTR");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a630;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_POLTR");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a630;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_ZOM");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a630;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_FRACT");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a630;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_SNORK");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a630;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_CAT");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a630;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_TUSH");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a630;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_PHANT");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a6f0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_TRADE");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a730;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_CROW");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a770;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("C_NIVA");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a7b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("C_HLCPTR");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a7f0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AF_MBALL");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a830;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AF_BDROP");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a830;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AF_NEEDL");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a830;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AF_BAST");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a830;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AF_BGRAV");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a830;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AF_DUMMY");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a830;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AF_ZUDA");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a830;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AF_THORN");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a830;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AF_FBALL");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a830;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AF_EBALL");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a830;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AF_RHAIR");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a830;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AF_GALAN");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a830;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("ARTEFACT");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a830;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_WMAGAZ");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a870;
  local_40 = pfVar6;
  local_38 = this;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_WMAGGL");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a8b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_FN2000");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a8b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_AK74");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a8b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_LR300");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a870;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_HPSA");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a870;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_PM");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a870;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_FORT");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a870;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_BINOC");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a870;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_SHOTGN");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a8f0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_SVD");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a870;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_SVU");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a870;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_RPG7");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a870;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_VAL");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a870;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_VINT");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a870;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_WALTHR");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a870;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_USP45");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a870;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_GROZA");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a8b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_KNIFE");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a930;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_BM16");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a8f0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_RG6");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a8f0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AMMO");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a970;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("A_VOG25");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a970;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("A_OG7B");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a970;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("A_M209");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a970;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_SCOPE");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a9b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_SILENC");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a9b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_GLAUNC");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a9b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("II_BOLT");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a9f0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("II_MEDKI");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a9b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("II_BANDG");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a9b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("II_ANTIR");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a9b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("II_FOOD");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a9b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("II_BOTTL");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a9b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("II_EXPLO");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024aa30;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("II_DOC");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024aa70;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("II_ATTCH");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a9b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("EQU_SCIE");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024aab0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("EQU_STLK");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024aab0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("EQU_MLTR");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024aab0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("EQU_EXO");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024aab0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("G_F1");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024aaf0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("G_RGD5");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024aaf0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("MP_PLBAG");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a9b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("Z_ZONE");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024ab30;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("Z_MBALD");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024ab70;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("Z_MINCER");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024ab70;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("Z_ACIDF");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024ab70;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("Z_GALANT");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024ab70;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("Z_RADIO");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024ab70;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("Z_BFUZZ");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024abb0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("Z_RUSTYH");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024abb0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("Z_DEAD");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024ab70;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SCRIPTZN");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024abf0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SMRTZONE");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024ac30;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("Z_TEAMBS");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024ac70;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("Z_TORRID");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024acb0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SPACE_RS");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024abf0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("Z_AMEBA");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024abb0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("Z_NOGRAV");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024ab70;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("D_SIMDET");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024acf0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("D_TORCH");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024ad30;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("D_PDA");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024ad70;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("O_SEARCH");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024adb0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_MOUNTD");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024adf0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_STMGUN");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024ae30;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("O_HLAMP");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024ae70;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("O_PHYSIC");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024aeb0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SCRPTOBJ");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024aef0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("O_BRKBL");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024af30;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("O_CLMBL");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024af70;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("P_SKELET");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024afb0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("P_DSTRBL");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024aeb0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("O_INVBOX");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024aff0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("D_ELITE");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024acf0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("D_ADVANC");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024acf0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("D_FLARE");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a9b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("II_BTTCH");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a9b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("NW_ATTCH");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a9b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("Z_CFIRE");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024ab70;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AF_CTA");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a830;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("O_DSTR_S");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024aeb0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SO_HLAMP");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024ae70;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("G_F1_S");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024aaf0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("G_RGD5_S");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024aaf0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("S_PDA");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024ad70;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("S_FOOD");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a9b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("WP_GLAUN");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a9b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("WP_SILEN");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a9b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AMMO_S");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a970;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("S_VOG25");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a970;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("S_M209");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a970;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("S_OG7B");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a970;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("E_HLMET");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b030;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("S_EXPLO");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024aa30;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("DET_ELIT");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024acf0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("LVL_CHNG");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b070;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SMRTTRRN");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b0b0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("RE_SPAWN");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b0f0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_STL_S");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b130;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("AI_TRD_S");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b170;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("C_HLCP_S");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b298;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SPC_RS_S");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b3f8;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("O_PHYS_S");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b4e0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SCRPTART");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b618;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SCRPTCAR");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b748;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SM_BLOOD");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b880;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SM_BOARW");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b880;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SM_DOG_S");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b880;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SM_FLESH");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b880;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SM_P_DOG");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b880;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SM_BURER");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b880;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SM_CAT_S");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b880;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SM_CHIMS");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b880;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SM_CONTR");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b880;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SM_IZLOM");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b880;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SM_POLTR");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b880;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SM_GIANT");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b880;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SM_ZOMBI");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b880;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SM_SNORK");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b880;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SM_TUSHK");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b880;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SM_DOG_P");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b880;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SM_DOG_F");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b880;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("TORCH_S");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b8c0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("E_STLK");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b9f0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("WP_SCOPE");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024bb20;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("WP_AK74");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024bc50;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("WP_LR300");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024bd80;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("WP_BINOC");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024bd80;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("WP_BM16");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024beb0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("WP_GROZA");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024bc50;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("WP_SVD");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024bd80;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("WP_HPSA");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024bd80;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("WP_KNIFE");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024bfe0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("WP_PM");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024bd80;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("WP_RG6");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024beb0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("WP_RPG7");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024bd80;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("WP_SHOTG");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024beb0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("WP_MAGAZ");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024bd80;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("WP_SVU");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024bd80;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("WP_USP45");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024bd80;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("WP_VAL");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024bd80;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("WP_VINT");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024bd80;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("WP_WALTH");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024bd80;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("ZS_BFUZZ");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024c110;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("ZS_MBALD");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024c150;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("ZS_GALAN");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024c150;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("ZS_MINCE");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024c150;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("S_ACTOR");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a5f0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SFACTION");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024c190;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SMRT_C_S");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024c1d0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("ANOMFLD1");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024c210;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("TURRETMG");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024c250;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("Z_MINES");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024c150;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("S_INVBOX");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024c290;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("ZS_RADIO");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024c150;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("ZS_TORRD");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024c2d0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("WP_ASHTG");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024beb0;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SM_KARLO");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b880;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("SM_RAT");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024b880;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("LA_SHELT");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024c310;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("IS_ATTCH");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024bb20;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("ZS_NOGRA");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024c150;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("ZS_RUSTY");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024c110;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("LA_PHSAF");
  pxVar4 = local_38;
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024c350;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("LA_SAFE");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024c350;
  local_40 = pfVar6;
  std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
  emplace_back<factory_item_base*>
            ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,&local_40);
  pfVar6 = (factory_item_base *)operator_new(0x10);
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024a538;
  uVar7 = xray_re::xr_clsid::to_quad("W_TURRET");
  (pfVar6->m_clsid).field_0.quad = uVar7;
  pfVar6->_vptr_factory_item_base = (_func_int **)&PTR__factory_item_base_0024c390;
  local_40 = pfVar6;
  ppfVar8 = std::vector<factory_item_base*,std::allocator<factory_item_base*>>::
            emplace_back<factory_item_base*>
                      ((vector<factory_item_base*,std::allocator<factory_item_base*>> *)this_00,
                       &local_40);
  iVar5 = (int)ppfVar8;
  ppfVar1 = (pxVar4->m_clsids).
            super__Vector_base<factory_item_base_*,_std::allocator<factory_item_base_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppfVar2 = (pxVar4->m_clsids).
            super__Vector_base<factory_item_base_*,_std::allocator<factory_item_base_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppfVar1 != ppfVar2) {
    uVar9 = (long)ppfVar2 - (long)ppfVar1 >> 3;
    lVar3 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<factory_item_base**,std::vector<factory_item_base*,std::allocator<factory_item_base*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<clsid_pred>>
              (ppfVar1,ppfVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<factory_item_base**,std::vector<factory_item_base*,std::allocator<factory_item_base*>>>,__gnu_cxx::__ops::_Iter_comp_iter<clsid_pred>>
              (ppfVar1,ppfVar2);
    iVar5 = extraout_EAX;
  }
  return iVar5;
}

Assistant:

void xr_entity_factory::init()
{
	// engine classes
	m_clsids.push_back(new factory_item<cse_alife_graph_point>("AI_GRAPH"));
	m_clsids.push_back(new factory_item<cse_alife_online_offline_group>("ON_OFF_G"));
	m_clsids.push_back(new factory_item<se_actor>("O_ACTOR"));	// was cse_alife_creature_actor in SoC
//	m_clsids.push_back(new factory_item<cse_spectator>("SPECT"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_FLESH"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_HIMER"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_DOG_R"));
	m_clsids.push_back(new factory_item<cse_alife_human_stalker>("AI_STL"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_BLOOD"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_BOAR"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_DOG_B"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_DOG_P"));
	m_clsids.push_back(new factory_item<cse_alife_psy_dog_phantom>("AI_DOG_F"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_BURER"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_GIANT"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_CONTR"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_POLTR"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_ZOM"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_FRACT"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_SNORK"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_CAT"));
	m_clsids.push_back(new factory_item<cse_alife_monster_base>("AI_TUSH"));
	m_clsids.push_back(new factory_item<cse_alife_creature_phantom>("AI_PHANT"));
	m_clsids.push_back(new factory_item<cse_alife_trader>("AI_TRADE"));
	m_clsids.push_back(new factory_item<cse_alife_creature_crow>("AI_CROW"));
	m_clsids.push_back(new factory_item<cse_alife_car>("C_NIVA"));
	m_clsids.push_back(new factory_item<cse_alife_helicopter>("C_HLCPTR"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_MBALL"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_BDROP"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_NEEDL"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_BAST"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_BGRAV"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_DUMMY"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_ZUDA"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_THORN"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_FBALL"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_EBALL"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_RHAIR"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_GALAN"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("ARTEFACT"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_WMAGAZ"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined_w_gl>("W_WMAGGL"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined_w_gl>("W_FN2000"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined_w_gl>("W_AK74"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_LR300"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_HPSA"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_PM"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_FORT"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_BINOC"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_shotgun>("W_SHOTGN"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_SVD"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_SVU"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_RPG7"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_VAL"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_VINT"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_WALTHR"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined>("W_USP45"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_magazined_w_gl>("W_GROZA"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon>("W_KNIFE"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_shotgun>("W_BM16"));
	m_clsids.push_back(new factory_item<cse_alife_item_weapon_shotgun>("W_RG6"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("AMMO"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("A_VOG25"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("A_OG7B"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("A_M209"));
	m_clsids.push_back(new factory_item<cse_alife_item>("W_SCOPE"));
	m_clsids.push_back(new factory_item<cse_alife_item>("W_SILENC"));
	m_clsids.push_back(new factory_item<cse_alife_item>("W_GLAUNC"));
	m_clsids.push_back(new factory_item<cse_alife_item_bolt>("II_BOLT"));
	m_clsids.push_back(new factory_item<cse_alife_item>("II_MEDKI"));
	m_clsids.push_back(new factory_item<cse_alife_item>("II_BANDG"));
	m_clsids.push_back(new factory_item<cse_alife_item>("II_ANTIR"));
	m_clsids.push_back(new factory_item<cse_alife_item>("II_FOOD"));
	m_clsids.push_back(new factory_item<cse_alife_item>("II_BOTTL"));
	m_clsids.push_back(new factory_item<cse_alife_item_explosive>("II_EXPLO"));
	m_clsids.push_back(new factory_item<cse_alife_item_document>("II_DOC"));
	m_clsids.push_back(new factory_item<cse_alife_item>("II_ATTCH"));
	m_clsids.push_back(new factory_item<cse_alife_item_custom_outfit>("EQU_SCIE"));
	m_clsids.push_back(new factory_item<cse_alife_item_custom_outfit>("EQU_STLK"));
	m_clsids.push_back(new factory_item<cse_alife_item_custom_outfit>("EQU_MLTR"));
	m_clsids.push_back(new factory_item<cse_alife_item_custom_outfit>("EQU_EXO"));
	m_clsids.push_back(new factory_item<cse_alife_item_grenade>("G_F1"));
	m_clsids.push_back(new factory_item<cse_alife_item_grenade>("G_RGD5"));
//	m_clsids.push_back(new factory_item<cse_temporary>("G_RPG7"));
//	m_clsids.push_back(new factory_item<cse_temporary>("G_FAKE"));
	m_clsids.push_back(new factory_item<cse_alife_item>("MP_PLBAG"));
	m_clsids.push_back(new factory_item<cse_alife_custom_zone>("Z_ZONE"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_MBALD"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_MINCER"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_ACIDF"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_GALANT"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_RADIO"));
	m_clsids.push_back(new factory_item<cse_alife_zone_visual>("Z_BFUZZ"));
	m_clsids.push_back(new factory_item<cse_alife_zone_visual>("Z_RUSTYH"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_DEAD"));
	m_clsids.push_back(new factory_item<cse_alife_space_restrictor>("SCRIPTZN"));
	m_clsids.push_back(new factory_item<cse_alife_smart_zone>("SMRTZONE"));
	m_clsids.push_back(new factory_item<cse_alife_team_base_zone>("Z_TEAMBS"));
	m_clsids.push_back(new factory_item<cse_alife_torrid_zone>("Z_TORRID"));
	m_clsids.push_back(new factory_item<cse_alife_space_restrictor>("SPACE_RS"));
	m_clsids.push_back(new factory_item<cse_alife_zone_visual>("Z_AMEBA"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_NOGRAV"));
	m_clsids.push_back(new factory_item<cse_alife_item_detector>("D_SIMDET"));
	m_clsids.push_back(new factory_item<cse_alife_item_torch>("D_TORCH"));
	m_clsids.push_back(new factory_item<cse_alife_item_pda>("D_PDA"));
	m_clsids.push_back(new factory_item<cse_alife_object_projector>("O_SEARCH"));
	m_clsids.push_back(new factory_item<cse_alife_mounted_weapon>("W_MOUNTD"));
	m_clsids.push_back(new factory_item<cse_alife_stationary_mgun>("W_STMGUN"));
	m_clsids.push_back(new factory_item<cse_alife_object_hanging_lamp>("O_HLAMP"));
	m_clsids.push_back(new factory_item<cse_alife_object_physic>("O_PHYSIC"));
	m_clsids.push_back(new factory_item<cse_alife_dynamic_object_visual>("SCRPTOBJ"));
	m_clsids.push_back(new factory_item<cse_alife_object_breakable>("O_BRKBL"));
	m_clsids.push_back(new factory_item<cse_alife_object_climable>("O_CLMBL"));
	m_clsids.push_back(new factory_item<cse_alife_ph_skeleton_object>("P_SKELET"));
	m_clsids.push_back(new factory_item<cse_alife_object_physic>("P_DSTRBL"));
	m_clsids.push_back(new factory_item<cse_inventory_box>("O_INVBOX"));
	// Clear Sky (including build 3120) engine classes
	m_clsids.push_back(new factory_item<cse_alife_item_detector>("D_ELITE"));
	m_clsids.push_back(new factory_item<cse_alife_item_detector>("D_ADVANC"));
	m_clsids.push_back(new factory_item<cse_alife_item>("D_FLARE"));
	m_clsids.push_back(new factory_item<cse_alife_item>("II_BTTCH"));
	m_clsids.push_back(new factory_item<cse_alife_item>("NW_ATTCH"));
	m_clsids.push_back(new factory_item<cse_alife_anomalous_zone>("Z_CFIRE"));
	m_clsids.push_back(new factory_item<cse_alife_item_artefact>("AF_CTA"));

	// CoP new engine classes
	m_clsids.push_back(new factory_item<cse_alife_object_physic>("O_DSTR_S"));
	m_clsids.push_back(new factory_item<cse_alife_object_hanging_lamp>("SO_HLAMP"));
	m_clsids.push_back(new factory_item<cse_alife_item_grenade>("G_F1_S"));
	m_clsids.push_back(new factory_item<cse_alife_item_grenade>("G_RGD5_S"));
	m_clsids.push_back(new factory_item<cse_alife_item_pda>("S_PDA"));
	m_clsids.push_back(new factory_item<cse_alife_item>("S_FOOD"));
	m_clsids.push_back(new factory_item<cse_alife_item>("WP_GLAUN"));
	m_clsids.push_back(new factory_item<cse_alife_item>("WP_SILEN"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("AMMO_S"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("S_VOG25"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("S_M209"));
	m_clsids.push_back(new factory_item<cse_alife_item_ammo>("S_OG7B"));
	m_clsids.push_back(new factory_item<cse_alife_item_helmet>("E_HLMET"));
	m_clsids.push_back(new factory_item<cse_alife_item_explosive>("S_EXPLO"));
	m_clsids.push_back(new factory_item<cse_alife_item_detector>("DET_ELIT"));

	// script classes
	m_clsids.push_back(new factory_item<se_level_changer>("LVL_CHNG"));	// was cse_alife_level_changer in pre-3502 builds
	m_clsids.push_back(new factory_item<se_smart_terrain>("SMRTTRRN"));
	m_clsids.push_back(new factory_item<se_respawn>("RE_SPAWN"));
//	m_clsids.push_back(new factory_item<cse_switcher>("O_SWITCH"));
	m_clsids.push_back(new factory_item<se_stalker>("AI_STL_S"));
	m_clsids.push_back(new factory_item<se_trader>("AI_TRD_S"));
	m_clsids.push_back(new factory_item<se_heli>("C_HLCP_S"));
	m_clsids.push_back(new factory_item<se_restrictor>("SPC_RS_S"));
	m_clsids.push_back(new factory_item<se_physic>("O_PHYS_S"));
	m_clsids.push_back(new factory_item<se_artefact>("SCRPTART"));
	m_clsids.push_back(new factory_item<se_car>("SCRPTCAR"));
	m_clsids.push_back(new factory_item<se_monster>("SM_BLOOD"));
	m_clsids.push_back(new factory_item<se_monster>("SM_BOARW"));
	m_clsids.push_back(new factory_item<se_monster>("SM_DOG_S"));
	m_clsids.push_back(new factory_item<se_monster>("SM_FLESH"));
	m_clsids.push_back(new factory_item<se_monster>("SM_P_DOG"));
	m_clsids.push_back(new factory_item<se_monster>("SM_BURER"));
	m_clsids.push_back(new factory_item<se_monster>("SM_CAT_S"));
	m_clsids.push_back(new factory_item<se_monster>("SM_CHIMS"));
	m_clsids.push_back(new factory_item<se_monster>("SM_CONTR"));
	m_clsids.push_back(new factory_item<se_monster>("SM_IZLOM"));
	m_clsids.push_back(new factory_item<se_monster>("SM_POLTR"));
	m_clsids.push_back(new factory_item<se_monster>("SM_GIANT"));
	m_clsids.push_back(new factory_item<se_monster>("SM_ZOMBI"));
	m_clsids.push_back(new factory_item<se_monster>("SM_SNORK"));
	m_clsids.push_back(new factory_item<se_monster>("SM_TUSHK"));
	m_clsids.push_back(new factory_item<se_monster>("SM_DOG_P"));
	m_clsids.push_back(new factory_item<se_monster>("SM_DOG_F"));
	m_clsids.push_back(new factory_item<se_item_torch>("TORCH_S"));
	m_clsids.push_back(new factory_item<se_outfit>("E_STLK"));
	m_clsids.push_back(new factory_item<se_item>("WP_SCOPE"));
	m_clsids.push_back(new factory_item<se_weapon_magazined_w_gl>("WP_AK74"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_LR300"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_BINOC"));
	m_clsids.push_back(new factory_item<se_weapon_shotgun>("WP_BM16"));
	m_clsids.push_back(new factory_item<se_weapon_magazined_w_gl>("WP_GROZA"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_SVD"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_HPSA"));
	m_clsids.push_back(new factory_item<se_weapon>("WP_KNIFE"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_PM"));
	m_clsids.push_back(new factory_item<se_weapon_shotgun>("WP_RG6"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_RPG7"));
	m_clsids.push_back(new factory_item<se_weapon_shotgun>("WP_SHOTG"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_MAGAZ"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_SVU"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_USP45"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_VAL"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_VINT"));
	m_clsids.push_back(new factory_item<se_weapon_magazined>("WP_WALTH"));
	m_clsids.push_back(new factory_item<se_zone_visual>("ZS_BFUZZ"));
	m_clsids.push_back(new factory_item<se_zone_anom>("ZS_MBALD"));
	m_clsids.push_back(new factory_item<se_zone_anom>("ZS_GALAN"));
	m_clsids.push_back(new factory_item<se_zone_anom>("ZS_MINCE"));
	// clear sky script classes
	m_clsids.push_back(new factory_item<se_actor>("S_ACTOR"));			// + CoP
	m_clsids.push_back(new factory_item<se_sim_faction>("SFACTION"));
	m_clsids.push_back(new factory_item<se_smart_cover>("SMRT_C_S"));	// + CoP

	// ZENOBIAN mod script classes
	m_clsids.push_back(new factory_item<se_anomaly_field>("ANOMFLD1"));
	m_clsids.push_back(new factory_item<se_turret_mgun>("TURRETMG"));
	m_clsids.push_back(new factory_item<se_zone_anom>("Z_MINES"));
	
	// CoP new script classes
	m_clsids.push_back(new factory_item<se_invbox>("S_INVBOX"));
	m_clsids.push_back(new factory_item<se_zone_anom>("ZS_RADIO"));
	m_clsids.push_back(new factory_item<se_zone_torrid>("ZS_TORRD"));
	m_clsids.push_back(new factory_item<se_weapon_shotgun>("WP_ASHTG"));

	//LA new script classes
	m_clsids.push_back(new factory_item<se_monster>("SM_KARLO"));
	m_clsids.push_back(new factory_item<se_monster>("SM_RAT"));
	m_clsids.push_back(new factory_item<se_shelter>("LA_SHELT"));
	m_clsids.push_back(new factory_item<se_item>("IS_ATTCH"));
	m_clsids.push_back(new factory_item<se_zone_anom>("ZS_NOGRA"));
	m_clsids.push_back(new factory_item<se_zone_visual>("ZS_RUSTY"));
	m_clsids.push_back(new factory_item<se_safe>("LA_PHSAF"));
	m_clsids.push_back(new factory_item<se_safe>("LA_SAFE"));
	m_clsids.push_back(new factory_item<cse_turret_mgun>("W_TURRET"));

	// prepare for bisection
	std::sort(m_clsids.begin(), m_clsids.end(), clsid_pred());
}